

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseAssembler::embedLabel(BaseAssembler *this,Label *label,size_t dataSize)

{
  uint uVar1;
  uint32_t sectionId;
  CodeHolder *this_00;
  LabelEntry *le;
  Logger *pLVar2;
  Section *pSVar3;
  Error EVar4;
  ulong uVar5;
  LabelLink *pLVar6;
  size_t offset;
  undefined1 *puVar7;
  uint8_t *__s;
  uint8_t uVar8;
  ulong uVar9;
  OffsetFormat of;
  RelocEntry *re;
  OffsetFormat local_160;
  undefined8 local_158;
  ulong uStack_150;
  undefined8 local_148;
  undefined1 *local_140;
  undefined1 local_138 [264];
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar4 = 5;
LAB_00115a1b:
    EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar4,(char *)0x0);
    return EVar4;
  }
  uVar1 = (label->super_Operand).super_Operand_._baseId;
  if ((*(uint *)&this_00->field_0x100 <= uVar1) ||
     (le = *(LabelEntry **)(*(long *)&this_00->_labelEntries + (ulong)uVar1 * 8),
     le == (LabelEntry *)0x0)) {
    EVar4 = 0xc;
    goto LAB_00115a1b;
  }
  uVar9 = (ulong)(((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * 4 + 4;
  if (dataSize != 0) {
    uVar9 = dataSize;
  }
  if ((8 < uVar9) ||
     (uVar5 = uVar9 - (uVar9 >> 1 & 0x5555555555555555),
     uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
     1 < (byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
    EVar4 = 0x33;
    goto LAB_00115a1b;
  }
  __s = this->_bufferPtr;
  if ((ulong)((long)this->_bufferEnd - (long)__s) < uVar9) {
    EVar4 = CodeHolder::growBuffer(this_00,&this->_section->_buffer,uVar9);
    if (EVar4 == 0) {
      __s = this->_bufferPtr;
    }
    else {
      EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar4,(char *)0x0);
      if (EVar4 != 0) {
        return EVar4;
      }
    }
  }
  if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
    local_140 = local_138;
    uStack_150 = 0;
    local_158 = (RelocEntry *)0x20;
    local_148 = 0x107;
    local_138[0] = 0;
    String::_opChar((String *)&local_158,kAppend,'.');
    Formatter::formatDataType
              ((String *)&local_158,(((this->super_BaseEmitter)._logger)->_options)._flags,
               (this->super_BaseEmitter)._environment._arch,dataTypeIdBySize[uVar9]);
    String::_opChar((String *)&local_158,kAppend,' ');
    Formatter::formatLabel
              ((String *)&local_158,kNone,&this->super_BaseEmitter,
               (label->super_Operand).super_Operand_._baseId);
    String::_opChar((String *)&local_158,kAppend,'\n');
    pLVar2 = (this->super_BaseEmitter)._logger;
    uVar5 = uStack_150;
    puVar7 = local_140;
    if (((ulong)local_158 & 0xff) < 0x1f) {
      uVar5 = (ulong)local_158 & 0xff;
      puVar7 = (undefined1 *)((long)&local_158 + 1);
    }
    (*pLVar2->_vptr_Logger[2])(pLVar2,puVar7,uVar5);
    String::reset((String *)&local_158);
  }
  EVar4 = CodeHolder::newRelocEntry
                    ((this->super_BaseEmitter)._code,(RelocEntry **)&local_158,kRelToAbs);
  if (EVar4 != 0) goto LAB_00115ba9;
  sectionId = this->_section->_id;
  local_158->_sourceSectionId = sectionId;
  offset = (long)this->_bufferPtr - (long)this->_bufferData;
  local_158->_sourceOffset = offset;
  (local_158->_format)._type = kUnsignedOffset;
  (local_158->_format)._flags = '\0';
  uVar8 = (uint8_t)uVar9;
  (local_158->_format)._regionSize = uVar8;
  (local_158->_format)._valueSize = uVar8;
  (local_158->_format)._valueOffset = '\0';
  (local_158->_format)._immBitCount = uVar8 * '\b';
  (local_158->_format)._immBitShift = '\0';
  (local_158->_format)._immDiscardLsb = '\0';
  if (le->_section == (Section *)0x0) {
    local_160._type = kUnsignedOffset;
    local_160._flags = '\0';
    local_160._valueOffset = '\0';
    local_160._immBitShift = '\0';
    local_160._immDiscardLsb = '\0';
    local_160._regionSize = uVar8;
    local_160._valueSize = uVar8;
    local_160._immBitCount = uVar8 * '\b';
    pLVar6 = CodeHolder::newLabelLink
                       ((this->super_BaseEmitter)._code,le,sectionId,offset,0,&local_160);
    if (pLVar6 != (LabelLink *)0x0) {
      pLVar6->relocId = local_158->_id;
      goto LAB_00115b05;
    }
  }
  else {
    local_158->_targetSectionId = le->_section->_id;
    local_158->_payload = le->_offset;
LAB_00115b05:
    memset(__s,0,uVar9);
    pSVar3 = this->_section;
    uVar5 = (long)(__s + uVar9) - (long)this->_bufferData;
    if (uVar5 <= (pSVar3->_buffer)._capacity) {
      this->_bufferPtr = __s + uVar9;
      uVar9 = (pSVar3->_buffer)._size;
      if (uVar5 < uVar9) {
        uVar5 = uVar9;
      }
      (pSVar3->_buffer)._size = uVar5;
      return 0;
    }
    embedLabel();
  }
  EVar4 = 1;
LAB_00115ba9:
  EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar4,(char *)0x0);
  return EVar4;
}

Assistant:

Error BaseAssembler::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  ASMJIT_ASSERT(_code != nullptr);
  RelocEntry* re;
  LabelEntry* le = _code->labelEntry(label);

  if (ASMJIT_UNLIKELY(!le))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  if (dataSize == 0)
    dataSize = registerSize();

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(dataSize) || dataSize > 8))
    return reportError(DebugUtils::errored(kErrorInvalidOperandSize));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<256> sb;
    sb.append('.');
    Formatter::formatDataType(sb, _logger->flags(), arch(), dataTypeIdBySize[dataSize]);
    sb.append(' ');
    Formatter::formatLabel(sb, FormatFlags::kNone, this, label.id());
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  Error err = _code->newRelocEntry(&re, RelocType::kRelToAbs);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  re->_sourceSectionId = _section->id();
  re->_sourceOffset = offset();
  re->_format.resetToSimpleValue(OffsetType::kUnsignedOffset, dataSize);

  if (le->isBound()) {
    re->_targetSectionId = le->section()->id();
    re->_payload = le->offset();
  }
  else {
    OffsetFormat of;
    of.resetToSimpleValue(OffsetType::kUnsignedOffset, dataSize);

    LabelLink* link = _code->newLabelLink(le, _section->id(), offset(), 0, of);
    if (ASMJIT_UNLIKELY(!link))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));

    link->relocId = re->id();
  }

  // Emit dummy DWORD/QWORD depending on the data size.
  writer.emitZeros(dataSize);
  writer.done(this);

  return kErrorOk;
}